

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

double __thiscall wdm::utils::pow(utils *this,double __x,double __y)

{
  vector<double,_std::allocator<double>_> *this_00;
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  ulong in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  size_t j;
  size_t i;
  vector<double,_std::allocator<double>_> *res;
  allocator_type *in_stack_ffffffffffffff88;
  size_type sVar5;
  utils *this_01;
  undefined8 local_50;
  undefined8 local_48;
  
  this_01 = this;
  this_00 = (vector<double,_std::allocator<double>_> *)
            std::vector<double,_std::allocator<double>_>::size(in_RSI);
  std::allocator<double>::allocator((allocator<double> *)0x107d78);
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,(size_type)this_01,(value_type *)this,in_stack_ffffffffffffff88);
  std::allocator<double>::~allocator((allocator<double> *)0x107d9d);
  dVar4 = extraout_XMM0_Qa;
  if (in_RDX != 0) {
    local_48 = 0;
    while (sVar5 = local_48, sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
          dVar4 = extraout_XMM0_Qa_00, sVar5 < sVar1) {
      for (local_50 = 0; local_50 < in_RDX; local_50 = local_50 + 1) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_48);
        dVar4 = *pvVar2;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)this_01,local_48);
        *pvVar3 = dVar4 * *pvVar3;
      }
      local_48 = local_48 + 1;
    }
  }
  return dVar4;
}

Assistant:

inline std::vector<double> pow(const std::vector<double>& x, size_t n)
{
    std::vector<double> res(x.size(), 1.0);
    if (n > 0) {
        for (size_t i = 0; i < x.size(); i++) {
            for (size_t j = 0; j < n; j++) {
                res[i] *= x[i];
            }
        }
    }

    return res;
}